

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# makefile.cpp
# Opt level: O1

QString * __thiscall
MakefileGenerator::prlFileName(QString *__return_storage_ptr__,MakefileGenerator *this,bool fixify)

{
  QMakeProject *pQVar1;
  QArrayData *pQVar2;
  char16_t *pcVar3;
  qsizetype qVar4;
  bool bVar5;
  long in_FS_OFFSET;
  ProKey local_d8;
  ProString local_a8;
  QStringBuilder<ProString,_QString_&> local_78;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  (__return_storage_ptr__->d).size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  (__return_storage_ptr__->d).d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  (__return_storage_ptr__->d).ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
  pQVar1 = this->project;
  ProKey::ProKey(&local_d8,"PRL_TARGET");
  QMakeEvaluator::first(&local_a8,&pQVar1->super_QMakeEvaluator,&local_d8);
  ProString::ProString(&local_78.a,&local_a8);
  local_78.b = &Option::prl_ext;
  QStringBuilder<ProString,_QString_&>::convertTo<QString>(__return_storage_ptr__,&local_78);
  if (&(local_78.a.m_string.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_78.a.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_78.a.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
         -1;
    UNLOCK();
    if (((local_78.a.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i ==
        0) {
      QArrayData::deallocate(&(local_78.a.m_string.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (&(local_a8.m_string.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_a8.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_a8.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
         -1;
    UNLOCK();
    if (((local_a8.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0
       ) {
      QArrayData::deallocate(&(local_a8.m_string.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (&(local_d8.super_ProString.m_string.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_d8.super_ProString.m_string.d.d)->super_QArrayData).ref_._q_value.
    super___atomic_base<int>._M_i =
         ((local_d8.super_ProString.m_string.d.d)->super_QArrayData).ref_._q_value.
         super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_d8.super_ProString.m_string.d.d)->super_QArrayData).ref_._q_value.
        super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_d8.super_ProString.m_string.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (fixify) {
    pQVar1 = this->project;
    ProKey::ProKey((ProKey *)&local_78,"DESTDIR");
    bVar5 = QMakeProject::isEmpty(pQVar1,(ProKey *)&local_78);
    if (&(local_78.a.m_string.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_78.a.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_78.a.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i
           + -1;
      UNLOCK();
      if (((local_78.a.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i
          == 0) {
        QArrayData::deallocate(&(local_78.a.m_string.d.d)->super_QArrayData,2,0x10);
      }
    }
    if (!bVar5) {
      pQVar1 = this->project;
      ProKey::ProKey((ProKey *)&local_a8,"DESTDIR");
      QMakeEvaluator::first(&local_78.a,&pQVar1->super_QMakeEvaluator,(ProKey *)&local_a8);
      ProString::toQString((QString *)&local_d8,&local_78.a);
      if (local_d8.super_ProString.m_string.d.ptr == (char16_t *)0x0) {
        local_d8.super_ProString.m_string.d.ptr = (char16_t *)&QString::_empty;
      }
      QString::insert((longlong)__return_storage_ptr__,(QChar *)0x0,
                      (longlong)local_d8.super_ProString.m_string.d.ptr);
      if (&(local_d8.super_ProString.m_string.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_d8.super_ProString.m_string.d.d)->super_QArrayData).ref_._q_value.
        super___atomic_base<int>._M_i =
             ((local_d8.super_ProString.m_string.d.d)->super_QArrayData).ref_._q_value.
             super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if (((local_d8.super_ProString.m_string.d.d)->super_QArrayData).ref_._q_value.
            super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(&(local_d8.super_ProString.m_string.d.d)->super_QArrayData,2,0x10);
        }
      }
      if (&(local_78.a.m_string.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_78.a.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_78.a.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>.
             _M_i + -1;
        UNLOCK();
        if (((local_78.a.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>.
            _M_i == 0) {
          QArrayData::deallocate(&(local_78.a.m_string.d.d)->super_QArrayData,2,0x10);
        }
      }
      if (&(local_a8.m_string.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_a8.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_a8.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i
             + -1;
        UNLOCK();
        if (((local_a8.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i
            == 0) {
          QArrayData::deallocate(&(local_a8.m_string.d.d)->super_QArrayData,2,0x10);
        }
      }
    }
    fileFixify((QString *)&local_78,this,__return_storage_ptr__,(FileFixifyTypes)0x3,true);
    pQVar2 = &((__return_storage_ptr__->d).d)->super_QArrayData;
    pcVar3 = (__return_storage_ptr__->d).ptr;
    (__return_storage_ptr__->d).d = local_78.a.m_string.d.d;
    (__return_storage_ptr__->d).ptr = local_78.a.m_string.d.ptr;
    qVar4 = (__return_storage_ptr__->d).size;
    (__return_storage_ptr__->d).size = local_78.a.m_string.d.size;
    local_78.a.m_string.d.d = (Data *)pQVar2;
    local_78.a.m_string.d.ptr = pcVar3;
    local_78.a.m_string.d.size = qVar4;
    if (pQVar2 != (QArrayData *)0x0) {
      LOCK();
      (pQVar2->ref_)._q_value.super___atomic_base<int>._M_i =
           (pQVar2->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((pQVar2->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(pQVar2,2,0x10);
      }
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

QString
MakefileGenerator::prlFileName(bool fixify)
{
    QString ret = project->first("PRL_TARGET") + Option::prl_ext;
    if(fixify) {
        if(!project->isEmpty("DESTDIR"))
            ret.prepend(project->first("DESTDIR").toQString());
        ret = fileFixify(ret, FileFixifyBackwards);
    }
    return ret;
}